

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::deviceQueueFamilyProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  TestStatus *pTVar3;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  size_t queueNdx;
  ulong uVar4;
  long lVar5;
  allocator<char> local_1d1;
  TestStatus *local_1d0;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  MessageBuilder local_1b0;
  
  pTVar2 = context->m_testCtx->m_log;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&queueProperties,vk,physicalDevice);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"device = ");
  local_1d0 = __return_storage_ptr__;
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(poVar1);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1b0.m_str;
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)queueProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)queueProperties.
                            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,": ");
    ::vk::operator<<((ostream *)poVar1,
                     (VkQueueFamilyProperties *)
                     ((long)&(queueProperties.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start)->queueFlags + lVar5));
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    lVar5 = lVar5 + 0x18;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Querying queue properties succeeded",&local_1d1);
  pTVar3 = local_1d0;
  tcu::TestStatus::pass(local_1d0,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base(&queueProperties.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               );
  return pTVar3;
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties (Context& context)
{
	TestLog&								log					= context.getTestContext().getLog();
	const vector<VkQueueFamilyProperties>	queueProperties		= getPhysicalDeviceQueueFamilyProperties(context.getInstanceInterface(), context.getPhysicalDevice());

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage;

	for (size_t queueNdx = 0; queueNdx < queueProperties.size(); queueNdx++)
		log << TestLog::Message << queueNdx << ": " << queueProperties[queueNdx] << TestLog::EndMessage;

	return tcu::TestStatus::pass("Querying queue properties succeeded");
}